

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
dynet::Softmax::forward_dev_impl<dynet::Device_CPU>
          (Softmax *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx)

{
  initializer_list<unsigned_int> x;
  initializer_list<unsigned_int> x_00;
  uint uVar1;
  const_reference ppTVar2;
  runtime_error *this_00;
  uint *puVar3;
  reference pvVar4;
  long in_RCX;
  vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *in_RDX;
  real rVar5;
  double in_XMM0_Qa;
  double __x;
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
  TVar6;
  Tensor *in_stack_000000b8;
  Tensor *in_stack_000000c0;
  Tensor *in_stack_000000c8;
  Device_CPU *in_stack_000000d0;
  array<int,_2> bcast;
  Tensor m;
  Tensor z;
  DefaultDevice *in_stack_fffffffffffffca8;
  TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_1>
  *in_stack_fffffffffffffcb0;
  Device *in_stack_fffffffffffffcb8;
  Tensor *in_stack_fffffffffffffcc0;
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
  *this_01;
  Dim *in_stack_fffffffffffffcc8;
  size_type __n;
  undefined4 in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd4;
  TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_0>
  *in_stack_fffffffffffffcd8;
  size_type in_stack_fffffffffffffce0;
  TensorBase<Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>,_0>
  local_218 [72];
  undefined1 local_1d0 [16];
  Dimensions local_1c0;
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
  local_1b8;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_1a8;
  TensorBase<Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_0>
  local_180 [36];
  undefined4 local_15c;
  undefined4 *local_158;
  undefined8 local_150;
  undefined4 local_c4;
  undefined4 *local_c0;
  undefined8 local_b8;
  long local_20;
  vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  ppTVar2 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                      (in_RDX,0);
  uVar1 = Dim::cols(&(*ppTVar2)->d);
  if (uVar1 != 1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Softmax not yet implemented for multiple columns");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_c4 = 1;
  local_c0 = &local_c4;
  local_b8 = 1;
  x._M_len = in_stack_fffffffffffffce0;
  x._M_array = (iterator)in_stack_fffffffffffffcd8;
  Dim::Dim((Dim *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),x,
           (uint)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
  Tensor::Tensor((Tensor *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                 in_stack_fffffffffffffcc8,(float *)in_stack_fffffffffffffcc0,
                 in_stack_fffffffffffffcb8,(DeviceMempool)((ulong)in_stack_fffffffffffffcb0 >> 0x20)
                );
  local_15c = 1;
  local_158 = &local_15c;
  local_150 = 1;
  x_00._M_len = in_stack_fffffffffffffce0;
  x_00._M_array = (iterator)in_stack_fffffffffffffcd8;
  Dim::Dim((Dim *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),x_00,
           (uint)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
  Tensor::Tensor((Tensor *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                 in_stack_fffffffffffffcc8,(float *)in_stack_fffffffffffffcc0,
                 in_stack_fffffffffffffcb8,(DeviceMempool)((ulong)in_stack_fffffffffffffcb0 >> 0x20)
                );
  std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[](local_18,0)
  ;
  logsumexp<dynet::Device_CPU>
            (in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000b8);
  if (*(int *)(local_20 + 0x20) == 1) {
    std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
              (local_18,0);
    local_1a8 = Tensor::t<1>(in_stack_fffffffffffffcc0);
    rVar5 = as_scalar((Tensor *)0xa23a89);
    __x = (double)(ulong)(uint)rVar5;
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_0>
    ::operator-((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_0>
                 *)in_stack_fffffffffffffcc8,(Scalar)((ulong)in_stack_fffffffffffffcc0 >> 0x20));
    Eigen::
    TensorBase<Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_0>
    ::exp(local_180,__x);
    join_0x00000010_0x00000000_ = Tensor::t<1>(in_stack_fffffffffffffcc0);
    local_1b8 = Eigen::
                TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_1>
                ::device<Eigen::DefaultDevice>(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    Eigen::
    TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
    ::operator=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
                 *)in_stack_fffffffffffffcc0,
                (TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>
                 *)in_stack_fffffffffffffcb8);
  }
  else {
    ppTVar2 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                        (local_18,0);
    uVar1 = Dim::rows(&(*ppTVar2)->d);
    __n = 0;
    this_01 = (TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
               *)local_1d0;
    puVar3 = (uint *)std::array<int,_2UL>::operator[]
                               ((array<int,_2UL> *)in_stack_fffffffffffffcb0,
                                (size_type)in_stack_fffffffffffffca8);
    *puVar3 = uVar1;
    pvVar4 = std::array<int,_2UL>::operator[]
                       ((array<int,_2UL> *)in_stack_fffffffffffffcb0,
                        (size_type)in_stack_fffffffffffffca8);
    *pvVar4 = 1;
    std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
              (local_18,__n);
    Tensor::tb<1>((Tensor *)CONCAT44(uVar1,in_stack_fffffffffffffcd0));
    Tensor::tb<1>((Tensor *)CONCAT44(uVar1,in_stack_fffffffffffffcd0));
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,0>::
    broadcast<std::array<int,2ul>>
              ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_0>
                *)this_01,(array<int,_2UL> *)in_stack_fffffffffffffcb8);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,0>::
    operator-(in_stack_fffffffffffffcd8,
              (TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>
               *)CONCAT44(uVar1,in_stack_fffffffffffffcd0));
    Eigen::
    TensorBase<Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>,_0>
    ::exp(local_218,in_XMM0_Qa);
    Tensor::tb<1>((Tensor *)CONCAT44(uVar1,in_stack_fffffffffffffcd0));
    TVar6 = Eigen::
            TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_1>
            ::device<Eigen::DefaultDevice>
                      ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_1>
                        *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    Eigen::
    TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
    ::operator=(this_01,(TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>
                         *)TVar6.m_device);
  }
  Tensor::~Tensor((Tensor *)0xa23cf3);
  Tensor::~Tensor((Tensor *)0xa23d00);
  return;
}

Assistant:

void Softmax::forward_dev_impl(const MyDevice & dev, const vector<const Tensor*>& xs, Tensor& fx) const {
  if (xs[0]->d.cols() != 1)
    throw std::runtime_error("Softmax not yet implemented for multiple columns");
  Tensor z(Dim({1},fx.d.bd), (float*)aux_mem, fx.device, DeviceMempool::FXS);
  Tensor m(Dim({1},fx.d.bd), (float*)aux_mem + fx.d.bd, fx.device, DeviceMempool::FXS);
  logsumexp(dev, *xs[0], m, z);
  if(fx.d.bd == 1) {
    fx.t<1>().device(*dev.edevice) = (xs[0]->t<1>() - as_scalar(z)).exp();
  } else {
    Eigen::array<int, 2> bcast; bcast[0] = xs[0]->d.rows(); bcast[1] = 1;
    fx.tb<1>().device(*dev.edevice) = (xs[0]->tb<1>() - z.tb<1>().broadcast(bcast)).exp();
  }
}